

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O2

void __thiscall
Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
          (DenseStorage<double,__1,__1,__1,_0> *this,Index size,Index rows,Index cols)

{
  double *pdVar1;
  
  if (this->m_cols * this->m_rows - size != 0) {
    free(this->m_data);
    if (size == 0) {
      pdVar1 = (double *)0x0;
    }
    else {
      pdVar1 = internal::conditional_aligned_new_auto<double,true>(size);
    }
    this->m_data = pdVar1;
  }
  this->m_rows = rows;
  this->m_cols = cols;
  return;
}

Assistant:

EIGEN_DEVICE_FUNC void resize(Index size, Index rows, Index cols)
    {
      if(size != m_rows*m_cols)
      {
        internal::conditional_aligned_delete_auto<T,(_Options&DontAlign)==0>(m_data, m_rows*m_cols);
        if (size)
          m_data = internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size);
        else
          m_data = 0;
        EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN({})
      }
      m_rows = rows;
      m_cols = cols;
    }